

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::prepareFunctionPointers
          (FunctionalTest *this)

{
  GetTransformFeedbackiv_ProcAddress p_Var1;
  TransformFeedbackBufferBase_ProcAddress p_Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  undefined1 local_190 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  p_Var1 = *(GetTransformFeedbackiv_ProcAddress *)(CONCAT44(extraout_var,iVar3) + 0xb30);
  this->m_gl_getTransformFeedbackiv = p_Var1;
  p_Var2 = *(TransformFeedbackBufferBase_ProcAddress *)(CONCAT44(extraout_var,iVar3) + 0x14b8);
  this->m_gl_TransformFeedbackBufferBase = p_Var2;
  if ((p_Var1 != (GetTransformFeedbackiv_ProcAddress)0x0) &&
     (p_Var2 != (TransformFeedbackBufferBase_ProcAddress)0x0)) {
    return;
  }
  local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_190 + 8),"Function pointers are set to NULL values.",0x29);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_190);
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::prepareFunctionPointers()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching function pointers. */
	m_gl_getTransformFeedbackiv		 = (GetTransformFeedbackiv_ProcAddress)gl.getTransformFeedbackiv;
	m_gl_TransformFeedbackBufferBase = (TransformFeedbackBufferBase_ProcAddress)gl.transformFeedbackBufferBase;

	if ((DE_NULL == m_gl_getTransformFeedbackiv) || (DE_NULL == m_gl_TransformFeedbackBufferBase))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function pointers are set to NULL values."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}